

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::GeneratedMessageReflection::HasBit
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  uint32 uVar1;
  uint32 uVar2;
  Type TVar3;
  LogMessage *pLVar4;
  Message **ppMVar5;
  uint *puVar6;
  bool *pbVar7;
  double *pdVar8;
  float *pfVar9;
  ArenaStringPtr *pAVar10;
  bool bVar11;
  LogFinisher local_d9;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (*(char *)(*(long *)(field + 0x80) + 0x6f) == '\x01') {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x7b3);
    pLVar4 = LogMessage::operator<<(&local_68,"CHECK failed: !field->options().weak(): ");
    LogFinisher::operator=((LogFinisher *)&local_d8,pLVar4);
    LogMessage::~LogMessage(&local_68);
  }
  this_00 = &this->schema_;
  if ((this->schema_).has_bits_offset_ != -1) {
    if ((this->schema_).has_bits_offset_ == -1) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x776);
      pLVar4 = LogMessage::operator<<(&local_a0,"CHECK failed: schema_.HasHasbits(): ");
      LogFinisher::operator=((LogFinisher *)&local_d8,pLVar4);
      LogMessage::~LogMessage(&local_a0);
    }
    uVar1 = ReflectionSchema::HasBitsOffset(this_00);
    uVar2 = ReflectionSchema::HasBitIndex(this_00,field);
    if (uVar2 == 0xffffffff) {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,1000);
      pLVar4 = LogMessage::operator<<(&local_d8,"CHECK failed: (has_bit_index) != (~0u): ");
      LogFinisher::operator=(&local_d9,pLVar4);
      LogMessage::~LogMessage(&local_d8);
    }
    return (*(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                     (ulong)(uVar2 >> 5) * 4 + (ulong)uVar1) >> (uVar2 & 0x1f) & 1) != 0;
  }
  TVar3 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) == 10) {
    if (this_00->default_instance_ == message) {
      return false;
    }
    ppMVar5 = GetRaw<google::protobuf::Message_const*>(this,message,field);
    goto LAB_00320109;
  }
  TVar3 = FieldDescriptor::type(field);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4)) {
  case 1:
  case 8:
    puVar6 = (uint *)GetRaw<int>(this,message,field);
    break;
  case 2:
    ppMVar5 = (Message **)GetRaw<long>(this,message,field);
    goto LAB_00320109;
  case 3:
    puVar6 = GetRaw<unsigned_int>(this,message,field);
    break;
  case 4:
    ppMVar5 = (Message **)GetRaw<unsigned_long>(this,message,field);
LAB_00320109:
    bVar11 = *ppMVar5 == (Message *)0x0;
    goto LAB_003201e7;
  case 5:
    pdVar8 = GetRaw<double>(this,message,field);
    bVar11 = *pdVar8 != 0.0;
    goto LAB_003201cc;
  case 6:
    pfVar9 = GetRaw<float>(this,message,field);
    bVar11 = *pfVar9 != 0.0;
LAB_003201cc:
    return (bool)(-bVar11 & 1);
  case 7:
    pbVar7 = GetRaw<bool>(this,message,field);
    return *pbVar7;
  case 9:
    pAVar10 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
    bVar11 = pAVar10->ptr_->_M_string_length == 0;
    goto LAB_003201e7;
  default:
    LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x7e4);
    pLVar4 = LogMessage::operator<<(&local_d8,"Reached impossible case in HasBit().");
    LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
    LogMessage::~LogMessage(&local_d8);
    return false;
  }
  bVar11 = *puVar6 == 0;
LAB_003201e7:
  return !bVar11;
}

Assistant:

inline bool GeneratedMessageReflection::HasBit(
    const Message& message, const FieldDescriptor* field) const {
  GOOGLE_DCHECK(!field->options().weak());
  if (schema_.HasHasbits()) {
    return IsIndexInHasBitSet(GetHasBits(message), schema_.HasBitIndex(field));
  }

  // proto3: no has-bits. All fields present except messages, which are
  // present only if their message-field pointer is non-NULL.
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    return !schema_.IsDefaultInstance(message) &&
        GetRaw<const Message*>(message, field) != NULL;
  } else {
    // Non-message field (and non-oneof, since that was handled in HasField()
    // before calling us), and singular (again, checked in HasField). So, this
    // field must be a scalar.

    // Scalar primitive (numeric or string/bytes) fields are present if
    // their value is non-zero (numeric) or non-empty (string/bytes).  N.B.:
    // we must use this definition here, rather than the "scalar fields
    // always present" in the proto3 docs, because MergeFrom() semantics
    // require presence as "present on wire", and reflection-based merge
    // (which uses HasField()) needs to be consistent with this.
    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default: {
            return GetField<ArenaStringPtr>(message, field).Get().size() > 0;
          }
        }
        return false;
      case FieldDescriptor::CPPTYPE_BOOL:
        return GetRaw<bool>(message, field) != false;
      case FieldDescriptor::CPPTYPE_INT32:
        return GetRaw<int32>(message, field) != 0;
      case FieldDescriptor::CPPTYPE_INT64:
        return GetRaw<int64>(message, field) != 0;
      case FieldDescriptor::CPPTYPE_UINT32:
        return GetRaw<uint32>(message, field) != 0;
      case FieldDescriptor::CPPTYPE_UINT64:
        return GetRaw<uint64>(message, field) != 0;
      case FieldDescriptor::CPPTYPE_FLOAT:
        return GetRaw<float>(message, field) != 0.0;
      case FieldDescriptor::CPPTYPE_DOUBLE:
        return GetRaw<double>(message, field) != 0.0;
      case FieldDescriptor::CPPTYPE_ENUM:
        return GetRaw<int>(message, field) != 0;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        // handled above; avoid warning
        break;
    }
    GOOGLE_LOG(FATAL) << "Reached impossible case in HasBit().";
    return false;
  }
}